

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_write_tile_obu_mt
               (AV1_COMP *cpi,uint8_t *dst,uint32_t *total_size,aom_write_bit_buffer *saved_wb,
               uint8_t obu_extn_header,FrameHeaderInfo *fh_info,int *largest_tile_id,
               uint *max_tile_size,uint32_t *obu_header_size,uint8_t **tile_data_start,
               int num_workers)

{
  PackBSTileOrder *__s;
  TileDataEnc *pTVar1;
  EncWorkerData *pEVar2;
  AVxWorker *pAVar3;
  long lVar4;
  ulong uVar5;
  uint16_t *puVar6;
  AVxWorkerInterface *pAVar7;
  uint64_t *puVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int *piVar14;
  ThreadData *__dest;
  AVxWorker *pAVar15;
  uint uVar16;
  uint8_t *puVar17;
  int iVar18;
  int iVar19;
  uint8_t *puVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  uint uVar25;
  uint uVar26;
  uint32_t *__s_00;
  PackBSParams *pack_bs_params_00;
  bool bVar27;
  ulong local_d098;
  uint local_d08c;
  MACROBLOCKD *local_d088;
  uint8_t *local_d080;
  ulong local_d078;
  ThreadData *local_d070;
  ulong local_d068;
  ulong local_d060;
  uint *local_d058;
  ulong local_d050;
  FrameHeaderInfo *local_d048;
  long local_d040;
  size_t tg_buf_size [512];
  int tg_size_mi [512];
  uint32_t tile_size [512];
  PackBSParams pack_bs_params [512];
  
  __s_00 = tile_size;
  local_d080 = dst;
  local_d058 = total_size;
  local_d048 = fh_info;
  memset(__s_00,0,0x800);
  lVar4 = 6;
  do {
    *(uint32_t **)((long)&pack_bs_params[0].saved_wb + lVar4 * 4) = __s_00;
    __s_00 = __s_00 + 1;
    lVar4 = lVar4 + 0x16;
  } while (lVar4 != 0x2c06);
  uVar25 = (cpi->common).tiles.rows * (cpi->common).tiles.cols;
  uVar13 = (ulong)uVar25;
  uVar26 = cpi->num_tg;
  uVar23 = (ulong)uVar26;
  iVar9 = (int)(uVar25 + uVar26 + -1) / (int)uVar26;
  memset(tg_size_mi,0,0x800);
  if (0 < (int)uVar25) {
    pTVar1 = cpi->tile_data;
    uVar12 = 1;
    piVar14 = &pack_bs_params[0].new_tg;
    lVar4 = 0;
    uVar16 = 0;
    iVar18 = 0;
    do {
      iVar19 = (*(int *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x32 + lVar4) -
               *(int *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x2e + lVar4)) *
               (*(int *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x3a + lVar4) -
               *(int *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x36 + lVar4));
      iVar18 = iVar18 + 1;
      bVar27 = (ulong)(uVar25 - 1) * 0x5d10 - lVar4 == 0;
      bVar24 = bVar27 || iVar18 == iVar9;
      *(uint8_t *)(piVar14 + -7) = obu_extn_header;
      ((PackBSParams *)(piVar14 + -0x15))->saved_wb = saved_wb;
      *(undefined8 *)(piVar14 + -6) = 0;
      uVar11 = (uint)bVar24;
      piVar14[-1] = uVar11;
      *piVar14 = uVar12;
      *(undefined8 *)(piVar14 + -3) =
           *(undefined8 *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x3e + lVar4);
      piVar14[-4] = iVar19;
      tg_size_mi[uVar16] = tg_size_mi[uVar16] + iVar19;
      if (bVar27 || iVar18 == iVar9) {
        iVar18 = 0;
      }
      uVar16 = uVar16 + uVar11;
      lVar4 = lVar4 + 0x5d10;
      piVar14 = piVar14 + 0x16;
      uVar12 = (uint)bVar24;
    } while (uVar13 * 0x5d10 - lVar4 != 0);
  }
  iVar18 = 0;
  local_d068 = uVar13;
  local_d060 = uVar13;
  memset(tg_buf_size,0,0x1000);
  local_d098 = cpi->available_bs_size;
  puVar20 = local_d080;
  local_d078 = local_d098;
  if (0 < (int)uVar26) {
    local_d088 = &(cpi->td).mb.e_mbd;
    local_d050 = (long)(cpi->common).mi_params.mi_rows * (long)(cpi->common).mi_params.mi_cols;
    local_d040 = (long)iVar9 * 0x58;
    pack_bs_params_00 = pack_bs_params;
    uVar10 = 0;
    local_d070 = (ThreadData *)CONCAT44(local_d070._4_4_,iVar9);
    uVar13 = local_d098;
    do {
      if (uVar10 == (int)uVar23 - 1) {
        local_d098 = 0;
        uVar23 = uVar13;
      }
      else {
        uVar23 = ((long)tg_size_mi[uVar10] * local_d078) / local_d050;
        local_d098 = uVar13 - uVar23;
      }
      tg_buf_size[uVar10] = uVar23;
      pack_bs_params_00->dst = puVar20;
      pack_bs_params_00->tile_data_curr = puVar20;
      av1_write_obu_tg_tile_headers(cpi,local_d088,pack_bs_params_00,iVar18);
      puVar20 = puVar20 + uVar23;
      tg_buf_size[uVar10] = uVar23 - (long)pack_bs_params_00->curr_tg_hdr_size;
      uVar10 = uVar10 + 1;
      uVar23 = (ulong)cpi->num_tg;
      iVar18 = iVar18 + (int)local_d070;
      pack_bs_params_00 = (PackBSParams *)((long)&pack_bs_params_00->saved_wb + local_d040);
      uVar13 = local_d098;
    } while ((long)uVar10 < (long)uVar23);
  }
  if (0 < (int)local_d060) {
    lVar4 = 0;
    uVar13 = 0;
    puVar17 = local_d080;
    uVar23 = local_d078;
    do {
      iVar9 = *(int *)((long)&pack_bs_params[0].new_tg + lVar4);
      uVar10 = local_d098;
      if (iVar9 != 0) {
        uVar10 = tg_buf_size[uVar13];
        uVar23 = uVar10;
      }
      iVar18 = *(int *)((long)&pack_bs_params[0].is_last_tile_in_tg + lVar4);
      if (iVar18 == 0) {
        uVar5 = ((long)*(int *)((long)&pack_bs_params[0].tile_size_mi + lVar4) * uVar23) /
                (ulong)(long)tg_size_mi[uVar13];
        local_d098 = uVar10 - uVar5;
      }
      else {
        local_d098 = 0;
        uVar5 = uVar10;
      }
      *(ulong *)((long)&pack_bs_params[0].tile_buf_size + lVar4) = uVar5;
      if (iVar9 == 0) {
        *(uint8_t **)((long)&pack_bs_params[0].dst + lVar4) = puVar20;
        *(uint8_t **)((long)&pack_bs_params[0].tile_data_curr + lVar4) = puVar17;
      }
      else {
        puVar20 = *(uint8_t **)((long)&pack_bs_params[0].dst + lVar4);
        puVar17 = *(uint8_t **)((long)&pack_bs_params[0].tile_data_curr + lVar4);
        *(ulong *)((long)&pack_bs_params[0].tile_buf_size + lVar4) =
             uVar5 + (long)*(int *)((long)&pack_bs_params[0].curr_tg_hdr_size + lVar4);
      }
      uVar13 = (ulong)(((int)uVar13 + 1) - (uint)(iVar18 == 0));
      puVar20 = puVar20 + *(long *)((long)&pack_bs_params[0].tile_buf_size + lVar4);
      lVar4 = lVar4 + 0x58;
    } while (local_d068 * 0x58 - lVar4 != 0);
  }
  local_d088 = (MACROBLOCKD *)(ulong)(uint)num_workers;
  if (0 < num_workers) {
    local_d070 = &cpi->td;
    lVar4 = (long)local_d088 + 1;
    lVar21 = (long)local_d088 * 0x38;
    lVar22 = (long)local_d088 * 0x1d0;
    do {
      pEVar2 = (cpi->mt_info).tile_thr_data;
      __dest = local_d070;
      if (lVar4 != 2) {
        __dest = *(ThreadData **)(pEVar2[-1].error_info.detail + lVar22 + -0x10);
      }
      pAVar15 = (cpi->mt_info).workers;
      *(ThreadData **)(pEVar2[-1].error_info.detail + lVar22 + -0x18) = __dest;
      if (__dest != local_d070) {
        memcpy(__dest,local_d070,0x256b0);
      }
      *(AV1_COMP **)(pEVar2[-1].error_info.detail + lVar22 + -0x20) = cpi;
      lVar4 = lVar4 + -1;
      iVar9 = (int)lVar4 + -1;
      *(int *)((long)&pEVar2[-1].start + lVar22) = iVar9;
      *(int *)((long)&pEVar2[-1].thread_id + lVar22) = iVar9;
      av1_reset_pack_bs_thread_data(*(ThreadData **)(pEVar2[-1].error_info.detail + lVar22 + -0x18))
      ;
      *(code **)((long)pAVar15 + lVar21 + -0x20) = pack_bs_worker_hook;
      *(char **)((long)pAVar15 + lVar21 + -0x18) = pEVar2[-1].error_info.detail + lVar22 + -0x20;
      *(PackBSParams **)((long)pAVar15 + lVar21 + -0x10) = pack_bs_params;
      lVar21 = lVar21 + -0x38;
      lVar22 = lVar22 + -0x1d0;
    } while (1 < lVar4);
  }
  iVar9 = (cpi->common).tiles.cols;
  iVar18 = (cpi->common).tiles.rows;
  (cpi->mt_info).pack_bs_sync.next_job_idx = 0;
  (cpi->mt_info).pack_bs_sync.pack_bs_mt_exit = false;
  __s = (cpi->mt_info).pack_bs_sync.pack_bs_tile_order;
  uVar26 = iVar9 * iVar18 & 0xffff;
  memset(__s,0,(ulong)(uVar26 << 4));
  if (uVar26 != 0) {
    puVar6 = &(cpi->mt_info).pack_bs_sync.pack_bs_tile_order[0].tile_idx;
    puVar8 = &cpi->tile_data->abs_sum_level;
    uVar23 = 0;
    do {
      ((PackBSTileOrder *)(puVar6 + -4))->abs_sum_level = *puVar8;
      *puVar6 = (uint16_t)uVar23;
      uVar23 = uVar23 + 1;
      puVar6 = puVar6 + 8;
      puVar8 = puVar8 + 0xba2;
    } while (uVar26 != uVar23);
  }
  qsort(__s,(ulong)uVar26,0x10,compare_tile_order);
  pAVar7 = aom_get_worker_interface();
  if (0 < num_workers) {
    lVar4 = (long)local_d088 + 1;
    lVar22 = (long)local_d088 * 0x38;
    do {
      pAVar15 = (cpi->mt_info).workers;
      *(undefined4 *)((long)&pAVar15[-1].had_error + lVar22) = 0;
      pAVar15 = (AVxWorker *)((long)&pAVar15[-1].impl_ + lVar22);
      if (lVar4 == 2) {
        (*pAVar7->execute)(pAVar15);
      }
      else {
        (*pAVar7->launch)(pAVar15);
      }
      lVar4 = lVar4 + -1;
      lVar22 = lVar22 + -0x38;
    } while (1 < lVar4);
  }
  pAVar7 = aom_get_worker_interface();
  pAVar15 = (cpi->mt_info).workers;
  iVar9 = pAVar15->had_error;
  if (iVar9 != 0) {
    memcpy(tg_buf_size,(void *)((long)pAVar15->data1 + 0x18),0x1a0);
  }
  if (1 < num_workers) {
    lVar4 = (long)local_d088 + 1;
    lVar22 = (long)local_d088 * 0x38;
    do {
      pAVar3 = (cpi->mt_info).workers;
      iVar18 = (*pAVar7->sync)((AVxWorker *)((long)&pAVar3[-1].impl_ + lVar22));
      if (iVar18 == 0) {
        memcpy(tg_buf_size,(void *)(*(long *)((long)&pAVar3[-1].data1 + lVar22) + 0x18),0x1a0);
        iVar9 = 1;
      }
      lVar4 = lVar4 + -1;
      lVar22 = lVar22 + -0x38;
    } while (2 < lVar4);
  }
  if (iVar9 != 0) {
    aom_internal_error_copy((cpi->common).error,(aom_internal_error_info *)tg_buf_size);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar15->data1 + 8) + 0x2b90) = (cpi->common).error;
  uVar26 = (cpi->common).tiles.rows * (cpi->common).tiles.cols;
  tg_buf_size[0] = 0;
  tg_size_mi[0] = 1;
  if (0 < (int)uVar26) {
    piVar14 = &pack_bs_params[0].new_tg;
    uVar23 = 0;
    lVar22 = 0;
    lVar4 = 0;
    puVar20 = local_d080;
    do {
      if (*piVar14 != 0) {
        uVar25 = *local_d058;
        tg_buf_size[0] = (long)piVar14[-5];
        *tile_data_start = *tile_data_start + piVar14[-5];
        puVar20 = local_d080 + uVar25;
        *obu_header_size = piVar14[-6];
      }
      uVar13 = *(ulong *)(piVar14 + -0x11);
      iVar9 = piVar14[-1];
      tg_buf_size[0] = tg_buf_size[0] + uVar13 + (ulong)(iVar9 == 0) * 4;
      if (*max_tile_size < uVar13) {
        *largest_tile_id = (int)uVar23;
        *max_tile_size = (uint)uVar13;
      }
      local_d08c = (uint)uVar13 + **(uint32_t **)(piVar14 + -0xf);
      if (uVar23 != 0) {
        memmove(local_d080 + lVar4,local_d080 + lVar22,(ulong)local_d08c);
      }
      if (iVar9 != 0) {
        av1_write_last_tile_info
                  (cpi,local_d048,((PackBSParams *)(piVar14 + -0x15))->saved_wb,tg_buf_size,puVar20,
                   &local_d08c,tile_data_start,largest_tile_id,tg_size_mi,*obu_header_size,
                   *(uint8_t *)(piVar14 + -7));
      }
      lVar22 = lVar22 + *(size_t *)(piVar14 + -9);
      *local_d058 = *local_d058 + local_d08c;
      lVar4 = lVar4 + (ulong)local_d08c;
      uVar23 = uVar23 + 1;
      piVar14 = piVar14 + 0x16;
    } while (uVar26 != uVar23);
  }
  if (0 < num_workers) {
    lVar22 = (long)local_d088 + 1;
    lVar4 = (long)local_d088 * 0x1d0 + -0x1c8;
    do {
      av1_accumulate_pack_bs_thread_data
                (cpi,*(ThreadData **)
                      ((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar4 + -0x20));
      lVar22 = lVar22 + -1;
      lVar4 = lVar4 + -0x1d0;
    } while (1 < lVar22);
  }
  return;
}

Assistant:

void av1_write_tile_obu_mt(
    AV1_COMP *const cpi, uint8_t *const dst, uint32_t *total_size,
    struct aom_write_bit_buffer *saved_wb, uint8_t obu_extn_header,
    const FrameHeaderInfo *fh_info, int *const largest_tile_id,
    unsigned int *max_tile_size, uint32_t *const obu_header_size,
    uint8_t **tile_data_start, const int num_workers) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;

  PackBSParams pack_bs_params[MAX_TILES];
  uint32_t tile_size[MAX_TILES] = { 0 };

  for (int tile_idx = 0; tile_idx < MAX_TILES; tile_idx++)
    pack_bs_params[tile_idx].total_size = &tile_size[tile_idx];

  init_tile_pack_bs_params(cpi, dst, saved_wb, pack_bs_params, obu_extn_header);
  prepare_pack_bs_workers(cpi, pack_bs_params, pack_bs_worker_hook,
                          num_workers);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, &cpi->common, num_workers);
  accumulate_pack_bs_data(cpi, pack_bs_params, dst, total_size, fh_info,
                          largest_tile_id, max_tile_size, obu_header_size,
                          tile_data_start, num_workers);
}